

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O1

void av1_cdef_mse_calc_block
               (CdefSearchCtx *cdef_search_ctx,aom_internal_error_info *error_info,int fbr,int fbc,
               int sb_count)

{
  undefined8 *puVar1;
  long *plVar2;
  byte bVar3;
  byte bVar4;
  YV12_BUFFER_CONFIG *pYVar5;
  CommonModeInfoParams *mi_params;
  byte bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  short sVar14;
  short sVar15;
  ulong uVar16;
  int iVar17;
  uint64_t uVar18;
  int64_t iVar19;
  BLOCK_SIZE bs;
  sbyte sVar20;
  undefined1 *puVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  int *piVar25;
  uint16_t *puVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  int mi_row;
  int iVar31;
  uint uVar32;
  uint uVar33;
  CdefSearchCtx *pCVar34;
  int mi_col;
  int iVar35;
  ulong uVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  long lVar44;
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  int iVar72;
  int iVar79;
  int iVar80;
  undefined1 auVar73 [16];
  int iVar81;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar89 [16];
  int dirinit;
  int ref_stride [3];
  cdef_list dlist [1024];
  int var [16] [16];
  int dir [16] [16];
  uint16_t inbuf [19008];
  uint8_t tmp_dst8 [16384];
  int iStack_12604;
  CdefSearchCtx *pCStack_12600;
  int iStack_125f8;
  int iStack_125f4;
  int iStack_125f0;
  int iStack_125ec;
  ulong uStack_125e8;
  ulong uStack_125e0;
  ulong uStack_125d8;
  ulong uStack_125d0;
  long lStack_125c8;
  long lStack_125c0;
  long lStack_125b8;
  uint8_t *puStack_125b0;
  int iStack_125a4;
  int iStack_125a0;
  int iStack_1259c;
  long lStack_12598;
  CommonModeInfoParams *pCStack_12590;
  ulong uStack_12588;
  uint8_t *puStack_12580;
  long lStack_12578;
  ulong uStack_12570;
  uint8_t *puStack_12568;
  ulong uStack_12560;
  int aiStack_12554 [3];
  BLOCK_SIZE (*paaBStack_12548) [2] [2];
  uint16_t *puStack_12540;
  ulong uStack_12538;
  ulong uStack_12530;
  macroblockd_plane *pmStack_12528;
  ulong uStack_12520;
  ulong uStack_12518;
  uint16_t *puStack_12510;
  BLOCK_SIZE *pBStack_12508;
  uint8_t *apuStack_12500 [4];
  cdef_list acStack_124e0 [1024];
  int aiStack_11ce0 [256];
  int aiStack_118e0 [256];
  undefined8 auStack_114e0 [3];
  undefined1 auStack_114c2 [546];
  undefined8 auStack_112a0 [2];
  uint16_t auStack_11290 [4];
  undefined8 auStack_11288 [4677];
  uint16_t local_8060 [16408];
  
  pYVar5 = cdef_search_ctx->ref;
  mi_params = cdef_search_ctx->mi_params;
  uStack_125d0 = (ulong)(uint)cdef_search_ctx->coeff_shift;
  pCStack_12600 = cdef_search_ctx;
  memset(aiStack_118e0,0,0x400);
  memset(aiStack_11ce0,0,0x400);
  pCVar34 = pCStack_12600;
  mi_col = fbc * 0x10;
  uVar22 = mi_params->mi_cols + fbc * -0x10;
  uStack_12588 = 0x10;
  if ((int)uVar22 < 0x10) {
    uStack_12588 = (ulong)uVar22;
  }
  mi_row = fbr * 0x10;
  iVar17 = mi_params->mi_rows + fbr * -0x10;
  iStack_125f0 = 0x10;
  if (iVar17 < 0x10) {
    iStack_125f0 = iVar17;
  }
  apuStack_12500[0] = (pYVar5->field_5).field_0.y_buffer;
  apuStack_12500[1] = (pYVar5->field_5).field_0.u_buffer;
  apuStack_12500[2] = (pYVar5->field_5).field_0.v_buffer;
  aiStack_12554[0] = (pYVar5->field_4).field_0.y_stride;
  aiStack_12554[1] = (pYVar5->field_4).field_0.uv_stride;
  bs = mi_params->mi_grid_base[mi_params->mi_stride * mi_row + mi_col]->bsize;
  iVar79 = 1;
  if ((byte)(bs - BLOCK_64X128) < 3) {
    bVar38 = (~bs & 0xe) == 0;
    iVar31 = bVar38 + 1;
    uVar28 = (uint)bVar38 * 0x10 + 0x10;
    if ((int)uVar22 <= (int)uVar28) {
      uVar28 = uVar22;
    }
    uStack_12588 = (ulong)uVar28;
    if ((~bs & 0xd) == 0) {
      iStack_125f0 = 0x20;
      if (iVar17 < 0x20) {
        iStack_125f0 = iVar17;
      }
      iVar79 = 2;
    }
  }
  else {
    bs = BLOCK_64X64;
    iVar31 = 1;
  }
  pCStack_12590 = mi_params;
  aiStack_12554[2] = aiStack_12554[1];
  uVar22 = av1_cdef_compute_sb_list(mi_params,mi_row,mi_col,acStack_124e0,bs);
  iStack_125f4 = pCVar34->nvfb;
  iStack_125f8 = pCVar34->nhfb;
  iStack_12604 = 0;
  lStack_12598 = (long)sb_count;
  if (0 < pCVar34->num_planes) {
    iStack_125a4 = iVar31 + fbc;
    iStack_125a0 = iVar79 + fbr;
    uVar28 = (uint)(fbr != 0) * 2;
    uStack_12520 = (ulong)uVar28;
    uVar29 = (uint)(fbc != 0) * 8;
    uStack_12518 = (ulong)uVar29;
    bVar38 = iStack_125a0 == iStack_125f4;
    bVar39 = iStack_125a4 == iStack_125f8;
    pmStack_12528 = pCVar34->plane;
    bVar40 = fbr == 0;
    uStack_12530 = (ulong)(uVar28 + (uint)!bVar38 * 2);
    uStack_12538 = (ulong)(uVar29 + (uint)!bVar39 * 8);
    iVar17 = -0x120;
    if (bVar40) {
      iVar17 = 0;
    }
    puStack_12540 = auStack_11290 + (int)(iVar17 + (uint)(fbc != 0) * -8);
    paaBStack_12548 = av1_ss_size_lookup + bs;
    lStack_12578 = lStack_12598 << 9;
    uStack_12570 = 0;
    do {
      bVar3 = (byte)pCVar34->mi_wide_l2[uStack_12570];
      bVar6 = bVar3 & 0x1f;
      iVar79 = (int)uStack_12588;
      uVar28 = iVar79 << bVar6;
      bVar4 = (byte)pCVar34->mi_high_l2[uStack_12570];
      uVar33 = iStack_125f0 << (bVar4 & 0x1f);
      uVar29 = mi_row << (bVar4 & 0x1f);
      uStack_125e0 = (ulong)uVar29;
      uVar32 = mi_col << (bVar3 & 0x1f);
      lStack_125b8 = (long)pmStack_12528[uStack_12570].subsampling_x;
      lStack_125c0 = (long)pmStack_12528[uStack_12570].subsampling_y;
      puStack_12568 = pmStack_12528[uStack_12570].dst.buf;
      iVar17 = pmStack_12528[uStack_12570].dst.stride;
      (*pCVar34->copy_fn)(puStack_12540,0x90,puStack_12568,uVar29 - (int)uStack_12520,
                          uVar32 - (int)uStack_12518,iVar17,(int)uStack_12530 + uVar33,
                          (int)uStack_12538 + uVar28);
      if (((fbc == 0 || bVar40) || bVar39) || bVar38) {
        if (iStack_125a0 == iStack_125f4) {
          lVar24 = (ulong)uVar28 - 1;
          auVar41._8_4_ = (int)lVar24;
          auVar41._0_8_ = lVar24;
          auVar41._12_4_ = (int)((ulong)lVar24 >> 0x20);
          puVar21 = auStack_114c2 + (long)(int)(uVar33 * 0x90 + 0x120) * 2;
          auVar41 = auVar41 ^ _DAT_004d17a0;
          lVar24 = 0;
          do {
            if (0 < iVar79 << bVar6) {
              lVar27 = 0;
              auVar62 = _DAT_004d1790;
              auVar89 = _DAT_004d1780;
              auVar66 = _DAT_004d3390;
              auVar67 = _DAT_004d3380;
              do {
                auVar48 = auVar62 ^ _DAT_004d17a0;
                iVar31 = auVar41._0_4_;
                iVar72 = -(uint)(iVar31 < auVar48._0_4_);
                iVar35 = auVar41._4_4_;
                auVar49._4_4_ = -(uint)(iVar35 < auVar48._4_4_);
                iVar81 = auVar41._8_4_;
                iVar80 = -(uint)(iVar81 < auVar48._8_4_);
                iVar23 = auVar41._12_4_;
                auVar49._12_4_ = -(uint)(iVar23 < auVar48._12_4_);
                auVar59._4_4_ = iVar72;
                auVar59._0_4_ = iVar72;
                auVar59._8_4_ = iVar80;
                auVar59._12_4_ = iVar80;
                auVar82 = pshuflw(in_XMM8,auVar59,0xe8);
                auVar51._4_4_ = -(uint)(auVar48._4_4_ == iVar35);
                auVar51._12_4_ = -(uint)(auVar48._12_4_ == iVar23);
                auVar51._0_4_ = auVar51._4_4_;
                auVar51._8_4_ = auVar51._12_4_;
                auVar86 = pshuflw(in_XMM9,auVar51,0xe8);
                auVar49._0_4_ = auVar49._4_4_;
                auVar49._8_4_ = auVar49._12_4_;
                auVar83 = pshuflw(auVar82,auVar49,0xe8);
                auVar48._8_4_ = 0xffffffff;
                auVar48._0_8_ = 0xffffffffffffffff;
                auVar48._12_4_ = 0xffffffff;
                auVar48 = (auVar83 | auVar86 & auVar82) ^ auVar48;
                auVar48 = packssdw(auVar48,auVar48);
                if ((auVar48 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar21 + lVar27 + -0xe) = 0x4000;
                }
                auVar49 = auVar51 & auVar59 | auVar49;
                auVar48 = packssdw(auVar49,auVar49);
                auVar83._8_4_ = 0xffffffff;
                auVar83._0_8_ = 0xffffffffffffffff;
                auVar83._12_4_ = 0xffffffff;
                auVar48 = packssdw(auVar48 ^ auVar83,auVar48 ^ auVar83);
                if ((auVar48._0_4_ >> 0x10 & 1) != 0) {
                  *(undefined2 *)(puVar21 + lVar27 + -0xc) = 0x4000;
                }
                auVar48 = auVar89 ^ _DAT_004d17a0;
                iVar72 = -(uint)(iVar31 < auVar48._0_4_);
                auVar73._4_4_ = -(uint)(iVar35 < auVar48._4_4_);
                iVar80 = -(uint)(iVar81 < auVar48._8_4_);
                auVar73._12_4_ = -(uint)(iVar23 < auVar48._12_4_);
                auVar50._4_4_ = iVar72;
                auVar50._0_4_ = iVar72;
                auVar50._8_4_ = iVar80;
                auVar50._12_4_ = iVar80;
                auVar58._4_4_ = -(uint)(auVar48._4_4_ == iVar35);
                auVar58._12_4_ = -(uint)(auVar48._12_4_ == iVar23);
                auVar58._0_4_ = auVar58._4_4_;
                auVar58._8_4_ = auVar58._12_4_;
                auVar73._0_4_ = auVar73._4_4_;
                auVar73._8_4_ = auVar73._12_4_;
                auVar48 = auVar58 & auVar50 | auVar73;
                auVar48 = packssdw(auVar48,auVar48);
                auVar7._8_4_ = 0xffffffff;
                auVar7._0_8_ = 0xffffffffffffffff;
                auVar7._12_4_ = 0xffffffff;
                auVar48 = packssdw(auVar48 ^ auVar7,auVar48 ^ auVar7);
                if ((auVar48 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar21 + lVar27 + -10) = 0x4000;
                }
                auVar51 = pshufhw(auVar50,auVar50,0x84);
                auVar59 = pshufhw(auVar58,auVar58,0x84);
                auVar49 = pshufhw(auVar51,auVar73,0x84);
                auVar52._8_4_ = 0xffffffff;
                auVar52._0_8_ = 0xffffffffffffffff;
                auVar52._12_4_ = 0xffffffff;
                auVar52 = (auVar49 | auVar59 & auVar51) ^ auVar52;
                auVar51 = packssdw(auVar52,auVar52);
                if ((auVar51 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar21 + lVar27 + -8) = 0x4000;
                }
                auVar51 = auVar66 ^ _DAT_004d17a0;
                iVar72 = -(uint)(iVar31 < auVar51._0_4_);
                auVar54._4_4_ = -(uint)(iVar35 < auVar51._4_4_);
                iVar80 = -(uint)(iVar81 < auVar51._8_4_);
                auVar54._12_4_ = -(uint)(iVar23 < auVar51._12_4_);
                auVar60._4_4_ = iVar72;
                auVar60._0_4_ = iVar72;
                auVar60._8_4_ = iVar80;
                auVar60._12_4_ = iVar80;
                auVar48 = pshuflw(auVar48,auVar60,0xe8);
                auVar53._4_4_ = -(uint)(auVar51._4_4_ == iVar35);
                auVar53._12_4_ = -(uint)(auVar51._12_4_ == iVar23);
                auVar53._0_4_ = auVar53._4_4_;
                auVar53._8_4_ = auVar53._12_4_;
                in_XMM9 = pshuflw(auVar86 & auVar82,auVar53,0xe8);
                in_XMM9 = in_XMM9 & auVar48;
                auVar54._0_4_ = auVar54._4_4_;
                auVar54._8_4_ = auVar54._12_4_;
                auVar48 = pshuflw(auVar48,auVar54,0xe8);
                auVar82._8_4_ = 0xffffffff;
                auVar82._0_8_ = 0xffffffffffffffff;
                auVar82._12_4_ = 0xffffffff;
                auVar82 = (auVar48 | in_XMM9) ^ auVar82;
                auVar48 = packssdw(auVar82,auVar82);
                if ((auVar48 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar21 + lVar27 + -6) = 0x4000;
                }
                auVar54 = auVar53 & auVar60 | auVar54;
                auVar48 = packssdw(auVar54,auVar54);
                auVar86._8_4_ = 0xffffffff;
                auVar86._0_8_ = 0xffffffffffffffff;
                auVar86._12_4_ = 0xffffffff;
                auVar48 = packssdw(auVar48 ^ auVar86,auVar48 ^ auVar86);
                if ((auVar48 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar21 + lVar27 + -4) = 0x4000;
                }
                auVar48 = auVar67 ^ _DAT_004d17a0;
                iVar31 = -(uint)(iVar31 < auVar48._0_4_);
                auVar74._4_4_ = -(uint)(iVar35 < auVar48._4_4_);
                iVar81 = -(uint)(iVar81 < auVar48._8_4_);
                auVar74._12_4_ = -(uint)(iVar23 < auVar48._12_4_);
                auVar55._4_4_ = iVar31;
                auVar55._0_4_ = iVar31;
                auVar55._8_4_ = iVar81;
                auVar55._12_4_ = iVar81;
                auVar61._4_4_ = -(uint)(auVar48._4_4_ == iVar35);
                auVar61._12_4_ = -(uint)(auVar48._12_4_ == iVar23);
                auVar61._0_4_ = auVar61._4_4_;
                auVar61._8_4_ = auVar61._12_4_;
                auVar74._0_4_ = auVar74._4_4_;
                auVar74._8_4_ = auVar74._12_4_;
                auVar48 = auVar61 & auVar55 | auVar74;
                auVar48 = packssdw(auVar48,auVar48);
                auVar8._8_4_ = 0xffffffff;
                auVar8._0_8_ = 0xffffffffffffffff;
                auVar8._12_4_ = 0xffffffff;
                in_XMM8 = packssdw(auVar48 ^ auVar8,auVar48 ^ auVar8);
                if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar21 + lVar27 + -2) = 0x4000;
                }
                auVar48 = pshufhw(auVar55,auVar55,0x84);
                auVar49 = pshufhw(auVar61,auVar61,0x84);
                auVar51 = pshufhw(auVar48,auVar74,0x84);
                auVar56._8_4_ = 0xffffffff;
                auVar56._0_8_ = 0xffffffffffffffff;
                auVar56._12_4_ = 0xffffffff;
                auVar56 = (auVar51 | auVar49 & auVar48) ^ auVar56;
                auVar48 = packssdw(auVar56,auVar56);
                if ((auVar48 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar21 + lVar27) = 0x4000;
                }
                lVar44 = auVar62._8_8_;
                auVar62._0_8_ = auVar62._0_8_ + 8;
                auVar62._8_8_ = lVar44 + 8;
                lVar44 = auVar89._8_8_;
                auVar89._0_8_ = auVar89._0_8_ + 8;
                auVar89._8_8_ = lVar44 + 8;
                lVar44 = auVar66._8_8_;
                auVar66._0_8_ = auVar66._0_8_ + 8;
                auVar66._8_8_ = lVar44 + 8;
                lVar44 = auVar67._8_8_;
                auVar67._0_8_ = auVar67._0_8_ + 8;
                auVar67._8_8_ = lVar44 + 8;
                lVar27 = lVar27 + 0x10;
              } while ((ulong)(uVar28 + 7 >> 3) << 4 != lVar27);
            }
            lVar24 = lVar24 + 1;
            puVar21 = puVar21 + 0x120;
          } while (lVar24 != 2);
LAB_001fefba:
          lVar24 = 0;
          do {
            puVar1 = (undefined8 *)
                     ((long)auStack_114e0 + lVar24 + (long)(int)(uVar33 * 0x90 + 0x120) * 2);
            *puVar1 = 0x4000400040004000;
            puVar1[1] = 0x4000400040004000;
            lVar24 = lVar24 + 0x120;
          } while (lVar24 != 0x240);
        }
        else if (fbc == 0) goto LAB_001fefba;
        if (bVar38 || bVar39) {
          lVar24 = 0x10;
          do {
            puVar1 = (undefined8 *)
                     ((long)auStack_114e0 + lVar24 + (long)(int)(uVar33 * 0x90 + uVar28 + 0x120) * 2
                     );
            *puVar1 = 0x4000400040004000;
            puVar1[1] = 0x4000400040004000;
            lVar24 = lVar24 + 0x120;
          } while (lVar24 != 0x250);
        }
        if (fbr == 0) {
          lVar24 = (ulong)uVar28 - 1;
          auVar42._8_4_ = (int)lVar24;
          auVar42._0_8_ = lVar24;
          auVar42._12_4_ = (int)((ulong)lVar24 >> 0x20);
          puVar21 = auStack_114c2;
          lVar24 = 0;
          do {
            if (0 < (int)uVar28) {
              lVar27 = 0;
              auVar43 = _DAT_004d1790;
              auVar45 = _DAT_004d1780;
              auVar46 = _DAT_004d3390;
              auVar47 = _DAT_004d3380;
              do {
                auVar41 = auVar42 ^ _DAT_004d17a0;
                auVar62 = auVar43 ^ _DAT_004d17a0;
                iVar79 = auVar41._0_4_;
                iVar23 = -(uint)(iVar79 < auVar62._0_4_);
                iVar31 = auVar41._4_4_;
                auVar64._4_4_ = -(uint)(iVar31 < auVar62._4_4_);
                iVar35 = auVar41._8_4_;
                iVar72 = -(uint)(iVar35 < auVar62._8_4_);
                iVar81 = auVar41._12_4_;
                auVar64._12_4_ = -(uint)(iVar81 < auVar62._12_4_);
                auVar75._4_4_ = iVar23;
                auVar75._0_4_ = iVar23;
                auVar75._8_4_ = iVar72;
                auVar75._12_4_ = iVar72;
                auVar41 = pshuflw(in_XMM9,auVar75,0xe8);
                auVar63._4_4_ = -(uint)(auVar62._4_4_ == iVar31);
                auVar63._12_4_ = -(uint)(auVar62._12_4_ == iVar81);
                auVar63._0_4_ = auVar63._4_4_;
                auVar63._8_4_ = auVar63._12_4_;
                auVar89 = pshuflw(in_XMM10,auVar63,0xe8);
                auVar64._0_4_ = auVar64._4_4_;
                auVar64._8_4_ = auVar64._12_4_;
                auVar62 = pshuflw(auVar41,auVar64,0xe8);
                auVar87._8_4_ = 0xffffffff;
                auVar87._0_8_ = 0xffffffffffffffff;
                auVar87._12_4_ = 0xffffffff;
                auVar87 = (auVar62 | auVar89 & auVar41) ^ auVar87;
                auVar62 = packssdw(auVar87,auVar87);
                if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar21 + lVar27 + -0xe) = 0x4000;
                }
                auVar64 = auVar63 & auVar75 | auVar64;
                auVar62 = packssdw(auVar64,auVar64);
                auVar9._8_4_ = 0xffffffff;
                auVar9._0_8_ = 0xffffffffffffffff;
                auVar9._12_4_ = 0xffffffff;
                auVar62 = packssdw(auVar62 ^ auVar9,auVar62 ^ auVar9);
                if ((auVar62._0_4_ >> 0x10 & 1) != 0) {
                  *(undefined2 *)(puVar21 + lVar27 + -0xc) = 0x4000;
                }
                auVar62 = auVar45 ^ _DAT_004d17a0;
                iVar23 = -(uint)(iVar79 < auVar62._0_4_);
                auVar84._4_4_ = -(uint)(iVar31 < auVar62._4_4_);
                iVar72 = -(uint)(iVar35 < auVar62._8_4_);
                auVar84._12_4_ = -(uint)(iVar81 < auVar62._12_4_);
                auVar65._4_4_ = iVar23;
                auVar65._0_4_ = iVar23;
                auVar65._8_4_ = iVar72;
                auVar65._12_4_ = iVar72;
                auVar76._4_4_ = -(uint)(auVar62._4_4_ == iVar31);
                auVar76._12_4_ = -(uint)(auVar62._12_4_ == iVar81);
                auVar76._0_4_ = auVar76._4_4_;
                auVar76._8_4_ = auVar76._12_4_;
                auVar84._0_4_ = auVar84._4_4_;
                auVar84._8_4_ = auVar84._12_4_;
                auVar62 = auVar76 & auVar65 | auVar84;
                auVar62 = packssdw(auVar62,auVar62);
                auVar10._8_4_ = 0xffffffff;
                auVar10._0_8_ = 0xffffffffffffffff;
                auVar10._12_4_ = 0xffffffff;
                auVar62 = packssdw(auVar62 ^ auVar10,auVar62 ^ auVar10);
                if ((auVar62 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar21 + lVar27 + -10) = 0x4000;
                }
                auVar66 = pshufhw(auVar65,auVar65,0x84);
                auVar48 = pshufhw(auVar76,auVar76,0x84);
                auVar67 = pshufhw(auVar66,auVar84,0x84);
                auVar68._8_4_ = 0xffffffff;
                auVar68._0_8_ = 0xffffffffffffffff;
                auVar68._12_4_ = 0xffffffff;
                auVar68 = (auVar67 | auVar48 & auVar66) ^ auVar68;
                auVar66 = packssdw(auVar68,auVar68);
                if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar21 + lVar27 + -8) = 0x4000;
                }
                auVar66 = auVar46 ^ _DAT_004d17a0;
                iVar23 = -(uint)(iVar79 < auVar66._0_4_);
                auVar70._4_4_ = -(uint)(iVar31 < auVar66._4_4_);
                iVar72 = -(uint)(iVar35 < auVar66._8_4_);
                auVar70._12_4_ = -(uint)(iVar81 < auVar66._12_4_);
                auVar77._4_4_ = iVar23;
                auVar77._0_4_ = iVar23;
                auVar77._8_4_ = iVar72;
                auVar77._12_4_ = iVar72;
                auVar62 = pshuflw(auVar62,auVar77,0xe8);
                auVar69._4_4_ = -(uint)(auVar66._4_4_ == iVar31);
                auVar69._12_4_ = -(uint)(auVar66._12_4_ == iVar81);
                auVar69._0_4_ = auVar69._4_4_;
                auVar69._8_4_ = auVar69._12_4_;
                in_XMM10 = pshuflw(auVar89 & auVar41,auVar69,0xe8);
                in_XMM10 = in_XMM10 & auVar62;
                auVar70._0_4_ = auVar70._4_4_;
                auVar70._8_4_ = auVar70._12_4_;
                auVar41 = pshuflw(auVar62,auVar70,0xe8);
                auVar88._8_4_ = 0xffffffff;
                auVar88._0_8_ = 0xffffffffffffffff;
                auVar88._12_4_ = 0xffffffff;
                auVar88 = (auVar41 | in_XMM10) ^ auVar88;
                auVar41 = packssdw(auVar88,auVar88);
                if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar21 + lVar27 + -6) = 0x4000;
                }
                auVar70 = auVar69 & auVar77 | auVar70;
                auVar41 = packssdw(auVar70,auVar70);
                auVar11._8_4_ = 0xffffffff;
                auVar11._0_8_ = 0xffffffffffffffff;
                auVar11._12_4_ = 0xffffffff;
                auVar41 = packssdw(auVar41 ^ auVar11,auVar41 ^ auVar11);
                if ((auVar41 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar21 + lVar27 + -4) = 0x4000;
                }
                auVar41 = auVar47 ^ _DAT_004d17a0;
                auVar85._0_4_ = -(uint)(iVar79 < auVar41._0_4_);
                auVar85._4_4_ = -(uint)(iVar31 < auVar41._4_4_);
                auVar85._8_4_ = -(uint)(iVar35 < auVar41._8_4_);
                auVar85._12_4_ = -(uint)(iVar81 < auVar41._12_4_);
                auVar71._4_4_ = auVar85._0_4_;
                auVar71._0_4_ = auVar85._0_4_;
                auVar71._8_4_ = auVar85._8_4_;
                auVar71._12_4_ = auVar85._8_4_;
                iVar79 = -(uint)(auVar41._4_4_ == iVar31);
                iVar31 = -(uint)(auVar41._12_4_ == iVar81);
                auVar57._4_4_ = iVar79;
                auVar57._0_4_ = iVar79;
                auVar57._8_4_ = iVar31;
                auVar57._12_4_ = iVar31;
                auVar78._4_4_ = auVar85._4_4_;
                auVar78._0_4_ = auVar85._4_4_;
                auVar78._8_4_ = auVar85._12_4_;
                auVar78._12_4_ = auVar85._12_4_;
                in_XMM9 = auVar57 & auVar71 | auVar78;
                auVar41 = packssdw(auVar85,in_XMM9);
                auVar12._8_4_ = 0xffffffff;
                auVar12._0_8_ = 0xffffffffffffffff;
                auVar12._12_4_ = 0xffffffff;
                in_XMM8 = packssdw(auVar41 ^ auVar12,auVar41 ^ auVar12);
                if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar21 + lVar27 + -2) = 0x4000;
                }
                auVar62 = pshufhw(auVar71,auVar71,0x84);
                auVar41 = pshufhw(auVar57,auVar57,0x84);
                auVar89 = pshufhw(auVar62,auVar78,0x84);
                auVar13._8_4_ = 0xffffffff;
                auVar13._0_8_ = 0xffffffffffffffff;
                auVar13._12_4_ = 0xffffffff;
                auVar41 = packssdw(auVar41 & auVar62,(auVar89 | auVar41 & auVar62) ^ auVar13);
                if ((auVar41 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar21 + lVar27) = 0x4000;
                }
                lVar44 = auVar43._8_8_;
                auVar43._0_8_ = auVar43._0_8_ + 8;
                auVar43._8_8_ = lVar44 + 8;
                lVar44 = auVar45._8_8_;
                auVar45._0_8_ = auVar45._0_8_ + 8;
                auVar45._8_8_ = lVar44 + 8;
                lVar44 = auVar46._8_8_;
                auVar46._0_8_ = auVar46._0_8_ + 8;
                auVar46._8_8_ = lVar44 + 8;
                lVar44 = auVar47._8_8_;
                auVar47._0_8_ = auVar47._0_8_ + 8;
                auVar47._8_8_ = lVar44 + 8;
                lVar27 = lVar27 + 0x10;
              } while ((ulong)(uVar28 + 7 >> 3) << 4 != lVar27);
            }
            lVar24 = lVar24 + 1;
            puVar21 = puVar21 + 0x120;
          } while (lVar24 != 2);
LAB_001ff2ff:
          lVar24 = 0;
          do {
            *(undefined8 *)((long)auStack_114e0 + lVar24) = 0x4000400040004000;
            *(undefined8 *)((long)auStack_114e0 + lVar24 + 8) = 0x4000400040004000;
            lVar24 = lVar24 + 0x120;
          } while (lVar24 != 0x240);
        }
        else if (fbc == 0) goto LAB_001ff2ff;
        if (bVar40 || bVar39) {
          lVar24 = 0x10;
          do {
            puVar1 = (undefined8 *)((long)auStack_114e0 + lVar24 + (long)(int)uVar28 * 2);
            *puVar1 = 0x4000400040004000;
            puVar1[1] = 0x4000400040004000;
            lVar24 = lVar24 + 0x120;
          } while (lVar24 != 0x250);
        }
        if ((fbc == 0) && (0 < (int)uVar33)) {
          lVar24 = 0;
          do {
            *(undefined8 *)((long)auStack_112a0 + lVar24) = 0x4000400040004000;
            *(undefined8 *)((long)auStack_112a0 + lVar24 + 8) = 0x4000400040004000;
            lVar24 = lVar24 + 0x120;
          } while ((ulong)uVar33 * 0x120 != lVar24);
        }
        if ((iStack_125a4 == iStack_125f8) && (0 < (int)uVar33)) {
          lVar24 = 0;
          do {
            puVar1 = (undefined8 *)((long)auStack_11290 + lVar24 + (long)(int)uVar28 * 2);
            *puVar1 = 0x4000400040004000;
            puVar1[1] = 0x4000400040004000;
            lVar24 = lVar24 + 0x120;
          } while ((ulong)uVar33 * 0x120 != lVar24);
        }
      }
      if (0 < pCStack_12600->total_strengths) {
        puStack_125b0 = apuStack_12500[uStack_12570];
        iVar79 = aiStack_12554[uStack_12570];
        uVar29 = 3 - (int)lStack_125b8;
        uVar30 = (ulong)uVar29;
        uVar28 = 3 - (int)lStack_125c0;
        uStack_12560 = (ulong)uVar28;
        pBStack_12508 = (*paaBStack_12548)[lStack_125b8] + lStack_125c0;
        iStack_1259c = uVar28 + uVar29;
        iStack_125ec = 1 << ((byte)uVar28 & 0x1f);
        puStack_12580 = puStack_125b0 + (iVar79 * (short)uStack_125e0 + (int)(short)uVar32);
        puStack_12510 =
             (uint16_t *)(puStack_12568 + ((short)uStack_125e0 * iVar17 + (int)(short)uVar32));
        lVar24 = 0;
        uStack_125e8 = uVar30;
        uStack_125d8 = (ulong)uVar32;
        do {
          uVar36 = uStack_12570;
          uVar16 = uStack_125d8;
          pCVar34 = pCStack_12600;
          uVar28 = pCStack_12600->pick_method;
          bVar37 = uVar28 < 3;
          sVar20 = bVar37 + 1;
          if (uVar28 == 5) {
            sVar20 = 0;
          }
          uVar29 = bVar37 + 1 + (uint)bVar37;
          if (uVar28 == 5) {
            uVar29 = 0;
          }
          uVar32 = (uint)lVar24 >> sVar20;
          uVar29 = uVar29 & (uint)lVar24;
          switch(uVar28) {
          case 1:
            piVar25 = priconv_lvl1;
            goto LAB_001ff531;
          case 2:
            piVar25 = priconv_lvl2;
LAB_001ff531:
            uVar32 = piVar25[uVar32];
            break;
          case 3:
            piVar25 = priconv_lvl2;
            goto LAB_001ff515;
          case 4:
            piVar25 = priconv_lvl4;
LAB_001ff515:
            uVar32 = piVar25[uVar32];
            uVar29 = secconv_lvl3[uVar29];
            break;
          case 5:
            uVar32 = priconv_lvl5[uVar32];
            uVar29 = 0;
          }
          iVar31 = (int)uStack_12570;
          iVar35 = (int)uStack_125d0;
          if (pCStack_12600->use_highbitdepth == false) {
            bVar3 = block_size_wide[*pBStack_12508];
            bVar4 = block_size_high[*pBStack_12508];
            if ((uint)bVar4 * (uint)bVar3 >> ((byte)iStack_1259c & 0x1f) == uVar22) {
              puVar26 = puStack_12510;
              iVar81 = iVar17;
              if (uVar29 != 0 || uVar32 != 0) {
                if (uVar29 == 3) {
                  uVar29 = 4;
                }
                av1_cdef_filter_fb((uint8_t *)local_8060,(uint16_t *)0x0,0x80,auStack_11290,
                                   pCStack_12600->xdec[uStack_12570],
                                   pCStack_12600->ydec[uStack_12570],(int (*) [16])aiStack_118e0,
                                   &iStack_12604,(int (*) [16])aiStack_11ce0,iVar31,acStack_124e0,
                                   uVar22,uVar32,uVar29,pCStack_12600->damping,iVar35);
                puVar26 = local_8060;
                iVar81 = 0x80;
              }
              uVar18 = (*aom_sse)(puStack_12580,iVar79,(uint8_t *)puVar26,iVar81,(uint)bVar3,
                                  (uint)bVar4);
              uVar30 = uStack_125e8;
            }
            else if (uVar29 == 0 && uVar32 == 0) {
              if ((int)uVar22 < 1) {
                uVar18 = 0;
              }
              else {
                uVar18 = 0;
                uVar36 = 0;
                do {
                  iVar35 = (int)uVar36;
                  bVar3 = acStack_124e0[uVar36].by;
                  bVar4 = acStack_124e0[uVar36].bx;
                  iVar31 = 1;
                  if ((((int)lStack_125b8 == (int)lStack_125c0) &&
                      (((uVar28 = iVar35 + 3, (int)uVar22 <= (int)uVar28 ||
                        (bVar3 != acStack_124e0[uVar28].by)) ||
                       (iVar31 = 4, bVar4 + 3 != (uint)acStack_124e0[uVar28].bx)))) &&
                     (((uVar28 = iVar35 + 1, (int)uVar22 <= (int)uVar28 ||
                       (bVar3 != acStack_124e0[uVar28].by)) ||
                      (iVar31 = 2, bVar4 + 1 != (uint)acStack_124e0[uVar28].bx)))) {
                    iVar31 = 1;
                  }
                  iVar81 = (int)(short)(((ushort)bVar3 << ((byte)uStack_12560 & 0x1f)) +
                                       (short)uStack_125e0);
                  iVar23 = (int)(short)(((ushort)bVar4 << ((byte)uVar30 & 0x1f)) + (short)uVar16);
                  iVar19 = (*aom_sse)(puStack_125b0 + (iVar81 * iVar79 + iVar23),iVar79,
                                      puStack_12568 + (iVar81 * iVar17 + iVar23),iVar17,
                                      iVar31 << ((byte)uVar30 & 0x1f),iStack_125ec);
                  uVar18 = uVar18 + iVar19;
                  uVar36 = (ulong)(uint)(iVar35 + iVar31);
                  uVar30 = uStack_125e8;
                } while (iVar35 + iVar31 < (int)uVar22);
              }
            }
            else {
              if (uVar29 == 3) {
                uVar29 = 4;
              }
              lStack_125c8 = lVar24;
              av1_cdef_filter_fb((uint8_t *)local_8060,(uint16_t *)0x0,0x80,auStack_11290,
                                 pCStack_12600->xdec[uStack_12570],pCStack_12600->ydec[uStack_12570]
                                 ,(int (*) [16])aiStack_118e0,&iStack_12604,
                                 (int (*) [16])aiStack_11ce0,iVar31,acStack_124e0,uVar22,uVar32,
                                 uVar29,pCStack_12600->damping,iVar35);
              uVar16 = uStack_125d8;
              uVar18 = 0;
              lVar24 = lStack_125c8;
              if (0 < (int)uVar22) {
                uVar18 = 0;
                uVar36 = 0;
                do {
                  iVar35 = (int)uVar36;
                  bVar3 = acStack_124e0[uVar36].by;
                  bVar4 = acStack_124e0[uVar36].bx;
                  sVar14 = (ushort)bVar3 << ((byte)uStack_12560 & 0x1f);
                  sVar15 = (ushort)bVar4 << ((byte)uVar30 & 0x1f);
                  iVar31 = 1;
                  if (((int)lStack_125b8 == (int)lStack_125c0) &&
                     ((((uVar28 = iVar35 + 3, (int)uVar22 <= (int)uVar28 ||
                        (bVar3 != acStack_124e0[uVar28].by)) ||
                       (iVar31 = 4, bVar4 + 3 != (uint)acStack_124e0[uVar28].bx)) &&
                      (((uVar28 = iVar35 + 1, (int)uVar22 <= (int)uVar28 ||
                        (bVar3 != acStack_124e0[uVar28].by)) ||
                       (iVar31 = 2, bVar4 + 1 != (uint)acStack_124e0[uVar28].bx)))))) {
                    iVar31 = 1;
                  }
                  iVar19 = (*aom_sse)(puStack_125b0 +
                                      ((int)(short)(sVar15 + (short)uVar16) +
                                      (short)((short)uStack_125e0 + sVar14) * iVar79),iVar79,
                                      (uint8_t *)
                                      ((long)local_8060 + (long)((int)sVar15 + sVar14 * 0x80)),0x80,
                                      iVar31 << ((byte)uVar30 & 0x1f),iStack_125ec);
                  uVar18 = uVar18 + iVar19;
                  uVar36 = (ulong)(uint)(iVar35 + iVar31);
                  lVar24 = lStack_125c8;
                } while (iVar35 + iVar31 < (int)uVar22);
              }
            }
          }
          else {
            if (uVar29 == 3) {
              uVar29 = 4;
            }
            lStack_125c8 = lVar24;
            av1_cdef_filter_fb((uint8_t *)0x0,local_8060,0x90,auStack_11290,
                               pCStack_12600->xdec[uStack_12570],pCStack_12600->ydec[uStack_12570],
                               (int (*) [16])aiStack_118e0,&iStack_12604,(int (*) [16])aiStack_11ce0
                               ,iVar31,acStack_124e0,uVar22,uVar32,uVar29,pCStack_12600->damping,
                               iVar35);
            lVar24 = lStack_125c8;
            uVar18 = (*pCVar34->compute_cdef_dist_fn)
                               (puStack_125b0,iVar79,local_8060,acStack_124e0,uVar22,
                                (BLOCK_SIZE)pCVar34->bsize[uVar36],iVar35,(int)uStack_125e0,
                                (int)uStack_125d8);
            uVar30 = uStack_125e8;
          }
          if (uStack_12570 < 2) {
            *(uint64_t *)((long)*pCStack_12600->mse[uStack_12570] + lVar24 * 8 + lStack_12578) =
                 uVar18;
          }
          else {
            plVar2 = (long *)((long)*pCStack_12600->mse[1] + lVar24 * 8 + lStack_12578);
            *plVar2 = *plVar2 + uVar18;
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 < pCStack_12600->total_strengths);
      }
      uStack_12570 = uStack_12570 + 1;
      pCVar34 = pCStack_12600;
    } while ((long)uStack_12570 < (long)pCStack_12600->num_planes);
  }
  pCVar34->sb_index[lStack_12598] = mi_row * pCStack_12590->mi_stride + mi_col;
  return;
}

Assistant:

void av1_cdef_mse_calc_block(CdefSearchCtx *cdef_search_ctx,
                             struct aom_internal_error_info *error_info,
                             int fbr, int fbc, int sb_count) {
  // TODO(aomedia:3276): Pass error_info to the low-level functions as required
  // in future to handle error propagation.
  (void)error_info;
  const CommonModeInfoParams *const mi_params = cdef_search_ctx->mi_params;
  const YV12_BUFFER_CONFIG *ref = cdef_search_ctx->ref;
  const int coeff_shift = cdef_search_ctx->coeff_shift;
  const int *mi_wide_l2 = cdef_search_ctx->mi_wide_l2;
  const int *mi_high_l2 = cdef_search_ctx->mi_high_l2;

  // Declare and initialize the temporary buffers.
  DECLARE_ALIGNED(32, uint16_t, inbuf[CDEF_INBUF_SIZE]);
  cdef_list dlist[MI_SIZE_128X128 * MI_SIZE_128X128];
  int dir[CDEF_NBLOCKS][CDEF_NBLOCKS] = { { 0 } };
  int var[CDEF_NBLOCKS][CDEF_NBLOCKS] = { { 0 } };
  uint16_t *const in = inbuf + CDEF_VBORDER * CDEF_BSTRIDE + CDEF_HBORDER;
  int nhb = AOMMIN(MI_SIZE_64X64, mi_params->mi_cols - MI_SIZE_64X64 * fbc);
  int nvb = AOMMIN(MI_SIZE_64X64, mi_params->mi_rows - MI_SIZE_64X64 * fbr);
  int hb_step = 1, vb_step = 1;
  BLOCK_SIZE bs;

  const MB_MODE_INFO *const mbmi =
      mi_params->mi_grid_base[MI_SIZE_64X64 * fbr * mi_params->mi_stride +
                              MI_SIZE_64X64 * fbc];

  uint8_t *ref_buffer[MAX_MB_PLANE] = { ref->y_buffer, ref->u_buffer,
                                        ref->v_buffer };
  int ref_stride[MAX_MB_PLANE] = { ref->y_stride, ref->uv_stride,
                                   ref->uv_stride };

  if (mbmi->bsize == BLOCK_128X128 || mbmi->bsize == BLOCK_128X64 ||
      mbmi->bsize == BLOCK_64X128) {
    bs = mbmi->bsize;
    if (bs == BLOCK_128X128 || bs == BLOCK_128X64) {
      nhb = AOMMIN(MI_SIZE_128X128, mi_params->mi_cols - MI_SIZE_64X64 * fbc);
      hb_step = 2;
    }
    if (bs == BLOCK_128X128 || bs == BLOCK_64X128) {
      nvb = AOMMIN(MI_SIZE_128X128, mi_params->mi_rows - MI_SIZE_64X64 * fbr);
      vb_step = 2;
    }
  } else {
    bs = BLOCK_64X64;
  }
  // Get number of 8x8 blocks which are not skip. Cdef processing happens for
  // 8x8 blocks which are not skip.
  const int cdef_count = av1_cdef_compute_sb_list(
      mi_params, fbr * MI_SIZE_64X64, fbc * MI_SIZE_64X64, dlist, bs);
  const bool is_fb_on_frm_left_boundary = (fbc == 0);
  const bool is_fb_on_frm_right_boundary =
      (fbc + hb_step == cdef_search_ctx->nhfb);
  const bool is_fb_on_frm_top_boundary = (fbr == 0);
  const bool is_fb_on_frm_bottom_boundary =
      (fbr + vb_step == cdef_search_ctx->nvfb);
  const int yoff = CDEF_VBORDER * (!is_fb_on_frm_top_boundary);
  const int xoff = CDEF_HBORDER * (!is_fb_on_frm_left_boundary);
  int dirinit = 0;
  for (int pli = 0; pli < cdef_search_ctx->num_planes; pli++) {
    /* We avoid filtering the pixels for which some of the pixels to
    average are outside the frame. We could change the filter instead,
    but it would add special cases for any future vectorization. */
    const int hfilt_size = (nhb << mi_wide_l2[pli]);
    const int vfilt_size = (nvb << mi_high_l2[pli]);
    const int ysize =
        vfilt_size + CDEF_VBORDER * (!is_fb_on_frm_bottom_boundary) + yoff;
    const int xsize =
        hfilt_size + CDEF_HBORDER * (!is_fb_on_frm_right_boundary) + xoff;
    const int row = fbr * MI_SIZE_64X64 << mi_high_l2[pli];
    const int col = fbc * MI_SIZE_64X64 << mi_wide_l2[pli];
    struct macroblockd_plane pd = cdef_search_ctx->plane[pli];
    cdef_search_ctx->copy_fn(&in[(-yoff * CDEF_BSTRIDE - xoff)], CDEF_BSTRIDE,
                             pd.dst.buf, row - yoff, col - xoff, pd.dst.stride,
                             ysize, xsize);
    fill_borders_for_fbs_on_frame_boundary(
        inbuf, hfilt_size, vfilt_size, is_fb_on_frm_left_boundary,
        is_fb_on_frm_right_boundary, is_fb_on_frm_top_boundary,
        is_fb_on_frm_bottom_boundary);
    for (int gi = 0; gi < cdef_search_ctx->total_strengths; gi++) {
      int pri_strength, sec_strength;
      get_cdef_filter_strengths(cdef_search_ctx->pick_method, &pri_strength,
                                &sec_strength, gi);
      const uint64_t curr_mse = get_filt_error(
          cdef_search_ctx, &pd, dlist, dir, &dirinit, var, in, ref_buffer[pli],
          ref_stride[pli], row, col, pri_strength, sec_strength, cdef_count,
          pli, coeff_shift, bs);
      if (pli < 2)
        cdef_search_ctx->mse[pli][sb_count][gi] = curr_mse;
      else
        cdef_search_ctx->mse[1][sb_count][gi] += curr_mse;
    }
  }
  cdef_search_ctx->sb_index[sb_count] =
      MI_SIZE_64X64 * fbr * mi_params->mi_stride + MI_SIZE_64X64 * fbc;
}